

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::Attribute::get_value<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Attribute *this)

{
  undefined8 *puVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  primvar::PrimVar::get_value<std::__cxx11::string>(&local_38,&this->_var);
  __return_storage_ptr__->has_value_ = local_38.has_value_;
  if (local_38.has_value_ == true) {
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
    *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
    if (local_38.contained.data.__align ==
        (anon_struct_8_0_00000001_for___align)((long)&local_38.contained + 0x10)) {
      *puVar1 = CONCAT71(local_38.contained._17_7_,local_38.contained._16_1_);
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_38.contained._24_8_;
    }
    else {
      *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
           local_38.contained.data.__align;
      *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
           CONCAT71(local_38.contained._17_7_,local_38.contained._16_1_);
    }
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }